

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat64x2OperationX86X64.cpp
# Opt level: O3

SIMDValue Js::SIMDFloat64x2Operation::OpReciprocal(SIMDValue *value)

{
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar1;
  
  aVar1.i32 = (Type  [4])divpd(_DAT_0111d560,value->field_0);
  return (SIMDValue)aVar1;
}

Assistant:

SIMDValue SIMDFloat64x2Operation::OpReciprocal(const SIMDValue& value)
    {
        X86SIMDValue x86Result;

        X86SIMDValue doubleOnes;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        doubleOnes.m128d_value = _mm_set_pd(1.0, 1.0);
        x86Result.m128d_value = _mm_div_pd(doubleOnes.m128d_value, v.m128d_value); // result = 1.0/value

        return X86SIMDValue::ToSIMDValue(x86Result);
    }